

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::CreateImageFromTexture::exec(CreateImageFromTexture *this,Thread *t)

{
  code *pcVar1;
  _func_int **pp_Var2;
  EGLDisplay pvVar3;
  EGLContext pvVar4;
  deUint32 dVar5;
  deBool dVar6;
  MessageBuilder *pMVar7;
  Texture *pTVar8;
  GLES2Context *pGVar9;
  EGLImageKHR pvVar10;
  EGLImage *pEVar11;
  MessageBuilder local_1620;
  MessageBuilder local_1490;
  MessageBuilder local_1300;
  MessageBuilder local_1170;
  MessageBuilder local_fe0;
  MessageBuilder local_e50;
  MessageBuilder local_cc0;
  MessageBuilder local_b30;
  MessageBuilder local_9a0;
  MessageBuilder local_810;
  MessageBuilder local_680;
  MessageBuilder local_4f0;
  MessageBuilder local_360;
  MessageBuilder local_1c0;
  undefined8 local_30;
  EGLint attribList [3];
  EGLThread *thread;
  Thread *t_local;
  CreateImageFromTexture *this_local;
  
  register0x00000000 =
       (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (register0x00000000 == (Thread *)0x0) {
    __cxa_bad_cast();
  }
  attribList[0] = 0x3038;
  local_30 = 0x30bc;
  tcu::ThreadUtil::Thread::newMessage(&local_1c0,register0x00000000);
  pMVar7 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1c0,(char (*) [39])"Begin -- glBindTexture(GL_TEXTURE_2D, ");
  pTVar8 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator->(&this->m_texture);
  pMVar7 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar7,&pTVar8->texture);
  pMVar7 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2a94734);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar7,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1c0);
  do {
    pcVar1 = *(code **)(*(long *)&stack0xffffffffffffffe0[1].super_Thread.m_attribs + 0xb8);
    pTVar8 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator->(&this->m_texture);
    (*pcVar1)(0xde1,pTVar8->texture);
    dVar5 = (**(code **)(*(long *)&stack0xffffffffffffffe0[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar5,"bindTexture(GL_TEXTURE_2D, m_texture->texture)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x777);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_360,stack0xffffffffffffffe0);
  pMVar7 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_360,(char (*) [23])"End -- glBindTexture()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar7,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_360);
  tcu::ThreadUtil::Thread::newMessage(&local_4f0,stack0xffffffffffffffe0);
  pMVar7 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_4f0,
                      (char (*) [74])
                      "Begin -- glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR)");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar7,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_4f0);
  do {
    (**(code **)(*(long *)&stack0xffffffffffffffe0[1].super_Thread.m_attribs + 0x1360))
              (0xde1,0x2801,0x2601);
    dVar5 = (**(code **)(*(long *)&stack0xffffffffffffffe0[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar5,"texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x77c);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_680,stack0xffffffffffffffe0);
  pMVar7 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_680,(char (*) [25])"End -- glTexParameteri()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar7,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_680);
  tcu::ThreadUtil::Thread::newMessage(&local_810,stack0xffffffffffffffe0);
  pMVar7 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_810,
                      (char (*) [74])
                      "Begin -- glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR)");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar7,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_810);
  do {
    (**(code **)(*(long *)&stack0xffffffffffffffe0[1].super_Thread.m_attribs + 0x1360))
              (0xde1,0x2800,0x2601);
    dVar5 = (**(code **)(*(long *)&stack0xffffffffffffffe0[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar5,"texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x780);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_9a0,stack0xffffffffffffffe0);
  pMVar7 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_9a0,(char (*) [25])"End -- glTexParameteri()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar7,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_9a0);
  tcu::ThreadUtil::Thread::newMessage(&local_b30,stack0xffffffffffffffe0);
  pMVar7 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_b30,
                      (char (*) [77])
                      "Begin -- glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE)"
                     );
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar7,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_b30);
  do {
    (**(code **)(*(long *)&stack0xffffffffffffffe0[1].super_Thread.m_attribs + 0x1360))
              (0xde1,0x2803,0x812f);
    dVar5 = (**(code **)(*(long *)&stack0xffffffffffffffe0[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar5,"texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x784);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_cc0,stack0xffffffffffffffe0);
  pMVar7 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_cc0,(char (*) [25])"End -- glTexParameteri()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar7,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_cc0);
  tcu::ThreadUtil::Thread::newMessage(&local_e50,stack0xffffffffffffffe0);
  pMVar7 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_e50,
                      (char (*) [77])
                      "Begin -- glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE)"
                     );
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar7,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_e50);
  do {
    (**(code **)(*(long *)&stack0xffffffffffffffe0[1].super_Thread.m_attribs + 0x1360))
              (0xde1,0x2802,0x812f);
    dVar5 = (**(code **)(*(long *)&stack0xffffffffffffffe0[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar5,"texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x788);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_fe0,stack0xffffffffffffffe0);
  pMVar7 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_fe0,(char (*) [25])"End -- glTexParameteri()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar7,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_fe0);
  tcu::ThreadUtil::Thread::newMessage(&local_1170,stack0xffffffffffffffe0);
  pMVar7 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1170,(char (*) [28])"Begin -- eglCreateImageKHR(");
  pGVar9 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->
                     ((SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)
                      &stack0xffffffffffffffe0[1].m_random);
  pMVar7 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar7,&pGVar9->display);
  pMVar7 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
  pGVar9 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->
                     ((SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)
                      &stack0xffffffffffffffe0[1].m_random);
  pMVar7 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar7,&pGVar9->context);
  pMVar7 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (pMVar7,(char (*) [26])", EGL_GL_TEXTURE_2D_KHR, ");
  pTVar8 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator->(&this->m_texture);
  pMVar7 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar7,&pTVar8->texture);
  pMVar7 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (pMVar7,(char (*) [45])", { EGL_GL_TEXTURE_LEVEL_KHR, 0, EGL_NONE })");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar7,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1170);
  pp_Var2 = stack0xffffffffffffffe0[1].super_Thread._vptr_Thread;
  pGVar9 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->
                     ((SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)
                      &stack0xffffffffffffffe0[1].m_random);
  pvVar3 = pGVar9->display;
  pGVar9 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->
                     ((SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)
                      &stack0xffffffffffffffe0[1].m_random);
  pvVar4 = pGVar9->context;
  pTVar8 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator->(&this->m_texture);
  pvVar10 = (EGLImageKHR)
            (**(code **)(*pp_Var2 + 0x40))(pp_Var2,pvVar3,pvVar4,0x30b1,pTVar8->texture,&local_30);
  pEVar11 = de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::operator->(&this->m_image);
  pEVar11->image = pvVar10;
  dVar5 = (**(code **)(*stack0xffffffffffffffe0[1].super_Thread._vptr_Thread + 0xf8))();
  eglu::checkError(dVar5,"eglCreateImageKHR()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                   ,0x78d);
  tcu::ThreadUtil::Thread::newMessage(&local_1300,stack0xffffffffffffffe0);
  pMVar7 = tcu::ThreadUtil::MessageBuilder::operator<<(&local_1300,(char (*) [8])"End -- ");
  pEVar11 = de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::operator->(&this->m_image);
  pMVar7 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar7,&pEVar11->image);
  pMVar7 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (pMVar7,(char (*) [23])" = eglCreateImageKHR()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar7,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1300);
  tcu::ThreadUtil::Thread::newMessage(&local_1490,stack0xffffffffffffffe0);
  pMVar7 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1490,(char (*) [41])"Begin -- glBindTexture(GL_TEXTURE_2D, 0)");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar7,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1490);
  do {
    (**(code **)(*(long *)&stack0xffffffffffffffe0[1].super_Thread.m_attribs + 0xb8))(0xde1,0);
    dVar5 = (**(code **)(*(long *)&stack0xffffffffffffffe0[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar5,"bindTexture(GL_TEXTURE_2D, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x791);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_1620,stack0xffffffffffffffe0);
  pMVar7 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1620,(char (*) [23])"End -- glBindTexture()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar7,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1620);
  return;
}

Assistant:

void CreateImageFromTexture::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	EGLint attribList[] = {
		EGL_GL_TEXTURE_LEVEL_KHR, 0,
		EGL_NONE
	};

	thread.newMessage() << "Begin -- glBindTexture(GL_TEXTURE_2D, " << m_texture->texture << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindTexture(GL_TEXTURE_2D, m_texture->texture));
	thread.newMessage() << "End -- glBindTexture()" << tcu::ThreadUtil::Message::End;

	// Make texture image complete...
	thread.newMessage() << "Begin -- glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR));
	thread.newMessage() << "End -- glTexParameteri()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR));
	thread.newMessage() << "End -- glTexParameteri()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE));
	thread.newMessage() << "End -- glTexParameteri()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE));
	thread.newMessage() << "End -- glTexParameteri()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- eglCreateImageKHR(" << thread.runtimeContext->display << ", " << thread.runtimeContext->context << ", EGL_GL_TEXTURE_2D_KHR, " << m_texture->texture << ", { EGL_GL_TEXTURE_LEVEL_KHR, 0, EGL_NONE })" << tcu::ThreadUtil::Message::End;
	m_image->image = thread.egl.createImageKHR(thread.runtimeContext->display, thread.runtimeContext->context, EGL_GL_TEXTURE_2D_KHR, (EGLClientBuffer)(deUintptr)m_texture->texture, attribList);
	EGLU_CHECK_MSG(thread.egl, "eglCreateImageKHR()");
	thread.newMessage() << "End -- " << m_image->image << " = eglCreateImageKHR()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glBindTexture(GL_TEXTURE_2D, 0)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindTexture(GL_TEXTURE_2D, 0));
	thread.newMessage() << "End -- glBindTexture()" << tcu::ThreadUtil::Message::End;
}